

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

lua_Unsigned lua_rawlen(lua_State *L,int idx)

{
  TValue *pTVar1;
  lua_Unsigned lVar2;
  byte bVar3;
  
  pTVar1 = index2value(L,idx);
  bVar3 = pTVar1->tt_ & 0x3f;
  if (bVar3 != 0x14) {
    if (bVar3 == 5) {
      lVar2 = luaH_getn((Table *)(pTVar1->value_).gc);
      return lVar2;
    }
    if (bVar3 != 7) {
      if (bVar3 == 4) {
        return (long)(char)(pTVar1->value_).f[0xb];
      }
      return 0;
    }
  }
  return *(lua_Unsigned *)((pTVar1->value_).f + 0x10);
}

Assistant:

LUA_API lua_Unsigned lua_rawlen (lua_State *L, int idx) {
  const TValue *o = index2value(L, idx);
  switch (ttypetag(o)) {
    case LUA_VSHRSTR: return cast(lua_Unsigned, tsvalue(o)->shrlen);
    case LUA_VLNGSTR: return cast(lua_Unsigned, tsvalue(o)->u.lnglen);
    case LUA_VUSERDATA: return cast(lua_Unsigned, uvalue(o)->len);
    case LUA_VTABLE: return luaH_getn(hvalue(o));
    default: return 0;
  }
}